

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_linear.c
# Opt level: O1

int linear_vari_process(SRC_PRIVATE *psrc,SRC_DATA *data)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  float *pfVar4;
  float *pfVar5;
  undefined1 auVar6 [16];
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double local_50;
  undefined8 uStack_30;
  
  lVar8 = data->input_frames;
  if (lVar8 < 1) {
    return 0;
  }
  pvVar3 = psrc->private_data;
  if (pvVar3 == (void *)0x0) {
    iVar7 = 5;
  }
  else {
    if (*(int *)((long)pvVar3 + 8) != 0) {
      iVar7 = *(int *)((long)pvVar3 + 4);
      if (0 < (long)iVar7) {
        pfVar4 = data->data_in;
        lVar10 = 0;
        do {
          *(float *)((long)pvVar3 + lVar10 * 4 + 0x30) = pfVar4[lVar10];
          lVar10 = lVar10 + 1;
        } while (iVar7 != lVar10);
      }
      *(undefined4 *)((long)pvVar3 + 8) = 0;
    }
    uVar2 = *(uint *)((long)pvVar3 + 4);
    lVar8 = lVar8 * (int)uVar2;
    *(long *)((long)pvVar3 + 0x10) = lVar8;
    lVar10 = data->output_frames * (long)(int)uVar2;
    *(long *)((long)pvVar3 + 0x20) = lVar10;
    *(undefined8 *)((long)pvVar3 + 0x28) = 0;
    *(undefined8 *)((long)pvVar3 + 0x18) = 0;
    dVar13 = psrc->last_ratio;
    iVar7 = 0x16;
    if ((0.00390625 <= dVar13) && (dVar13 <= 256.0)) {
      dVar15 = psrc->last_position;
      local_50 = dVar13;
      if (dVar15 < 1.0) {
        lVar9 = *(long *)((long)pvVar3 + 0x28);
        do {
          if ((lVar10 <= lVar9) || ((double)lVar8 <= (dVar15 + 1.0) * (double)(int)uVar2 + 0.0))
          break;
          if ((0 < lVar10) && (1e-20 < ABS(dVar13 - data->src_ratio))) {
            local_50 = ((data->src_ratio - dVar13) * (double)lVar9) / (double)lVar10 + dVar13;
          }
          if (0 < (int)uVar2) {
            pfVar4 = data->data_in;
            pfVar5 = data->data_out;
            uVar12 = 0;
            do {
              fVar1 = *(float *)((long)pvVar3 + uVar12 * 4 + 0x30);
              pfVar5[lVar9 + uVar12] =
                   (float)((double)(pfVar4[uVar12] - fVar1) * dVar15 + (double)fVar1);
              uVar12 = uVar12 + 1;
            } while (uVar2 != uVar12);
            lVar9 = lVar9 + uVar12;
            *(long *)((long)pvVar3 + 0x28) = lVar9;
          }
          dVar15 = dVar15 + 1.0 / local_50;
        } while (dVar15 < 1.0);
      }
      lVar8 = lrint(dVar15);
      dVar13 = dVar15 - (double)lVar8;
      dVar13 = (double)(~-(ulong)(dVar13 < 0.0) & (ulong)dVar13 |
                       (ulong)(dVar13 + 1.0) & -(ulong)(dVar13 < 0.0));
      iVar7 = *(int *)((long)pvVar3 + 4);
      lVar8 = lrint(dVar15 - dVar13);
      lVar9 = lVar8 * iVar7 + *(long *)((long)pvVar3 + 0x18);
      *(long *)((long)pvVar3 + 0x18) = lVar9;
      lVar8 = *(long *)((long)pvVar3 + 0x20);
      lVar10 = *(long *)((long)pvVar3 + 0x28);
      if (lVar10 < lVar8) {
        uStack_30 = 0;
        do {
          uVar2 = *(uint *)((long)pvVar3 + 4);
          if ((double)*(long *)((long)pvVar3 + 0x10) <= (double)(int)uVar2 * dVar13 + (double)lVar9)
          break;
          if (0 < lVar8) {
            dVar15 = psrc->last_ratio;
            if (1e-20 < ABS(dVar15 - data->src_ratio)) {
              local_50 = ((data->src_ratio - dVar15) * (double)lVar10) / (double)lVar8 + dVar15;
            }
          }
          if (0 < (int)uVar2) {
            pfVar4 = data->data_in;
            lVar8 = *(long *)((long)pvVar3 + 0x28);
            pfVar5 = data->data_out;
            uVar12 = 0;
            do {
              fVar1 = pfVar4[(lVar9 - (ulong)uVar2) + uVar12];
              pfVar5[lVar8 + uVar12] =
                   (float)((double)(pfVar4[lVar9 + uVar12] - fVar1) * dVar13 + (double)fVar1);
              uVar12 = uVar12 + 1;
            } while (uVar2 != uVar12);
            *(ulong *)((long)pvVar3 + 0x28) = lVar8 + uVar12;
          }
          dVar15 = dVar13 + 1.0 / local_50;
          lVar8 = lrint(dVar15);
          dVar13 = dVar15 - (double)lVar8;
          auVar14._0_8_ = ~-(ulong)(dVar13 < 0.0) & (ulong)dVar13;
          auVar14._8_8_ = 0;
          auVar6._8_4_ = (int)uStack_30;
          auVar6._0_8_ = (ulong)(dVar13 + 1.0) & -(ulong)(dVar13 < 0.0);
          auVar6._12_4_ = (int)((ulong)uStack_30 >> 0x20);
          iVar7 = *(int *)((long)pvVar3 + 4);
          dVar13 = SUB168(auVar14 | auVar6,0);
          lVar8 = lrint(dVar15 - dVar13);
          uStack_30 = SUB168(auVar14 | auVar6,8);
          lVar9 = lVar8 * iVar7 + *(long *)((long)pvVar3 + 0x18);
          *(long *)((long)pvVar3 + 0x18) = lVar9;
          lVar8 = *(long *)((long)pvVar3 + 0x20);
          lVar10 = *(long *)((long)pvVar3 + 0x28);
        } while (lVar10 < lVar8);
      }
      lVar8 = *(long *)((long)pvVar3 + 0x10);
      if (lVar9 - lVar8 != 0 && lVar8 <= lVar9) {
        dVar13 = dVar13 + (double)((lVar9 - lVar8) / (long)*(int *)((long)pvVar3 + 4));
        *(long *)((long)pvVar3 + 0x18) = lVar8;
      }
      psrc->last_position = dVar13;
      lVar8 = *(long *)((long)pvVar3 + 0x18);
      if ((0 < lVar8) && (lVar9 = (long)*(int *)((long)pvVar3 + 4), 0 < lVar9)) {
        pfVar4 = data->data_in;
        lVar11 = 0;
        do {
          *(float *)((long)pvVar3 + lVar11 * 4 + 0x30) = pfVar4[(lVar8 - lVar9) + lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar9 != lVar11);
      }
      psrc->last_ratio = local_50;
      iVar7 = *(int *)((long)pvVar3 + 4);
      data->input_frames_used = lVar8 / (long)iVar7;
      data->output_frames_gen = lVar10 / (long)iVar7;
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

static int
linear_vari_process (SRC_PRIVATE *psrc, SRC_DATA *data)
{	LINEAR_DATA *priv ;
	double		src_ratio, input_index, rem ;
	int			ch ;

	if (data->input_frames <= 0)
		return SRC_ERR_NO_ERROR ;

	if (psrc->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	priv = (LINEAR_DATA*) psrc->private_data ;

	if (priv->reset)
	{	/* If we have just been reset, set the last_value data. */
		for (ch = 0 ; ch < priv->channels ; ch++)
			priv->last_value [ch] = data->data_in [ch] ;
		priv->reset = 0 ;
		} ;

	priv->in_count = data->input_frames * priv->channels ;
	priv->out_count = data->output_frames * priv->channels ;
	priv->in_used = priv->out_gen = 0 ;

	src_ratio = psrc->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	input_index = psrc->last_position ;

	/* Calculate samples before first sample in input array. */
	while (input_index < 1.0 && priv->out_gen < priv->out_count)
	{
		if (priv->in_used + priv->channels * (1.0 + input_index) >= priv->in_count)
			break ;

		if (priv->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = psrc->last_ratio + priv->out_gen * (data->src_ratio - psrc->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < priv->channels ; ch++)
		{	data->data_out [priv->out_gen] = (float) (priv->last_value [ch] + input_index *
										(data->data_in [ch] - priv->last_value [ch])) ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		} ;

	rem = fmod_one (input_index) ;
	priv->in_used += priv->channels * lrint (input_index - rem) ;
	input_index = rem ;

	/* Main processing loop. */
	while (priv->out_gen < priv->out_count && priv->in_used + priv->channels * input_index < priv->in_count)
	{
		if (priv->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = psrc->last_ratio + priv->out_gen * (data->src_ratio - psrc->last_ratio) / priv->out_count ;

		if (SRC_DEBUG && priv->in_used < priv->channels && input_index < 1.0)
		{	printf ("Whoops!!!!   in_used : %ld     channels : %d     input_index : %f\n", priv->in_used, priv->channels, input_index) ;
			exit (1) ;
			} ;

		for (ch = 0 ; ch < priv->channels ; ch++)
		{	data->data_out [priv->out_gen] = (float) (data->data_in [priv->in_used - priv->channels + ch] + input_index *
						(data->data_in [priv->in_used + ch] - data->data_in [priv->in_used - priv->channels + ch])) ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		priv->in_used += priv->channels * lrint (input_index - rem) ;
		input_index = rem ;
		} ;

	if (priv->in_used > priv->in_count)
	{	input_index += (priv->in_used - priv->in_count) / priv->channels ;
		priv->in_used = priv->in_count ;
		} ;

	psrc->last_position = input_index ;

	if (priv->in_used > 0)
		for (ch = 0 ; ch < priv->channels ; ch++)
			priv->last_value [ch] = data->data_in [priv->in_used - priv->channels + ch] ;

	/* Save current ratio rather then target ratio. */
	psrc->last_ratio = src_ratio ;

	data->input_frames_used = priv->in_used / priv->channels ;
	data->output_frames_gen = priv->out_gen / priv->channels ;

	return SRC_ERR_NO_ERROR ;
}